

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_history.cpp
# Opt level: O0

void __thiscall
NshHistoryIsEmpty_SuccessEmpty_Test::TestBody(NshHistoryIsEmpty_SuccessEmpty_Test *this)

{
  nsh_history_t *hist_00;
  bool bVar1;
  char *message;
  AssertHelper local_858;
  Message local_850 [3];
  bool local_832;
  bool local_831;
  undefined1 local_830 [8];
  AssertionResult gtest_ar;
  nsh_history_t hist;
  NshHistoryIsEmpty_SuccessEmpty_Test *this_local;
  
  hist_00 = (nsh_history_t *)
            ((long)&gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            + 4);
  nsh_history_reset(hist_00);
  local_831 = nsh_history_is_empty(hist_00);
  local_832 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_830,"nsh_history_is_empty(&hist)","true",&local_831,&local_832);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_830);
  if (!bVar1) {
    testing::Message::Message(local_850);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_830);
    testing::internal::AssertHelper::AssertHelper
              (&local_858,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/juliencombattelli[P]nsh/test/units/test_nsh_history.cpp"
               ,0x71,message);
    testing::internal::AssertHelper::operator=(&local_858,local_850);
    testing::internal::AssertHelper::~AssertHelper(&local_858);
    testing::Message::~Message(local_850);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_830);
  return;
}

Assistant:

TEST(NshHistoryIsEmpty, SuccessEmpty)
{
    nsh_history_t hist;
    nsh_history_reset(&hist);

    ASSERT_EQ(nsh_history_is_empty(&hist), true);
}